

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpt.cpp
# Opt level: O0

void __thiscall pg::QPTSolver::liftloop(QPTSolver *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  ostream *poVar6;
  Error *this_00;
  char *pcVar7;
  _label_vertex _Var8;
  int local_fc;
  int *pm_1;
  int v_1;
  _label_vertex local_70;
  Game *local_60;
  int local_58;
  _label_vertex local_50;
  uint *local_40;
  int *pm;
  int v;
  int from;
  int *curedge;
  int n_1;
  int n;
  int i_1;
  int i;
  QPTSolver *this_local;
  
  _i_1 = this;
  for (n = 0; lVar4 = (long)n, iVar2 = this->k, lVar5 = Solver::nodecount(&this->super_Solver),
      lVar4 < iVar2 * lVar5; n = n + 1) {
    this->pm_nodes[n] = -1;
  }
  for (n_1 = 0; lVar4 = (long)n_1, lVar5 = Solver::nodecount(&this->super_Solver), lVar4 < lVar5;
      n_1 = n_1 + 1) {
    this->strategy[n_1] = -1;
  }
  lVar4 = Solver::nodecount(&this->super_Solver);
  curedge._4_4_ = (int)lVar4;
  while (curedge._4_4_ = curedge._4_4_ + -1, -1 < curedge._4_4_) {
    bVar1 = bitset::operator[]((this->super_Solver).disabled,(long)curedge._4_4_);
    if (!bVar1) {
      this->lift_attempt = this->lift_attempt + 1;
      bVar1 = lift(this,curedge._4_4_,-1);
      if (bVar1) {
        this->lift_count = this->lift_count + 1;
        todo_push(this,curedge._4_4_);
      }
    }
  }
  while (this_local = (QPTSolver *)&this->todo, (this->todo).pointer != 0) {
    curedge._0_4_ = todo_pop(this);
    for (_v = Solver::ins(&this->super_Solver,(int)curedge); *_v != -1; _v = _v + 1) {
      pm._4_4_ = *_v;
      bVar1 = bitset::operator[]((this->super_Solver).disabled,(long)pm._4_4_);
      if (!bVar1) {
        this->lift_attempt = this->lift_attempt + 1;
        bVar1 = lift(this,pm._4_4_,(int)curedge);
        if (bVar1) {
          this->lift_count = this->lift_count + 1;
          todo_push(this,pm._4_4_);
        }
      }
    }
  }
  if ((this->super_Solver).trace != 0) {
    for (pm._0_4_ = 0; lVar4 = (long)(int)pm, lVar5 = Solver::nodecount(&this->super_Solver),
        lVar4 < lVar5; pm._0_4_ = (int)pm + 1) {
      bVar1 = bitset::operator[]((this->super_Solver).disabled,(long)(int)pm);
      if (!bVar1) {
        local_40 = (uint *)(this->pm_nodes + (int)pm * this->k);
        poVar6 = std::operator<<((this->super_Solver).logger,"\x1b[1m");
        _Var8 = Solver::label_vertex(&this->super_Solver,(int)pm);
        local_60 = _Var8.g;
        local_58 = _Var8.v;
        local_50.g = local_60;
        local_50.v = local_58;
        poVar6 = operator<<(poVar6,&local_50);
        iVar2 = Solver::owner(&this->super_Solver,(int)pm);
        pcVar7 = " (even)";
        if (iVar2 != 0) {
          pcVar7 = " (odd)";
        }
        poVar6 = std::operator<<(poVar6,pcVar7);
        std::operator<<(poVar6,"\x1b[m:");
        pm_stream((this->super_Solver).logger,(int *)local_40,this->k);
        if (((*local_40 == 0xffffffff) || ((*local_40 & 1) != this->pl)) &&
           (iVar2 = Solver::owner(&this->super_Solver,(int)pm), iVar2 != this->pl)) {
          if (this->strategy[(int)pm] == -1) {
            std::operator<<((this->super_Solver).logger," no strategy!");
          }
          else {
            poVar6 = std::operator<<((this->super_Solver).logger," => ");
            _Var8 = Solver::label_vertex(&this->super_Solver,this->strategy[(int)pm]);
            local_70.g = _Var8.g;
            local_70.v = _Var8.v;
            operator<<(poVar6,&local_70);
          }
        }
        std::ostream::operator<<((this->super_Solver).logger,std::endl<char,std::char_traits<char>>)
        ;
      }
    }
  }
  pm_1._4_4_ = 0;
  do {
    lVar4 = Solver::nodecount(&this->super_Solver);
    if (lVar4 <= pm_1._4_4_) {
      Solver::flush(&this->super_Solver);
      return;
    }
    bVar1 = bitset::operator[]((this->super_Solver).disabled,(long)pm_1._4_4_);
    if ((!bVar1) &&
       ((this->pm_nodes[pm_1._4_4_ * this->k] == 0xffffffff ||
        ((this->pm_nodes[pm_1._4_4_ * this->k] & 1U) != this->pl)))) {
      iVar2 = Solver::owner(&this->super_Solver,pm_1._4_4_);
      if ((iVar2 != this->pl) && (this->strategy[pm_1._4_4_] == -1)) {
        this_00 = (Error *)__cxa_allocate_exception(0x40);
        Error::Error(this_00,"logic error",
                     "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/qpt.cpp"
                     ,0x1d4);
        __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
      }
      iVar2 = this->pl;
      iVar3 = Solver::owner(&this->super_Solver,pm_1._4_4_);
      if (iVar3 == this->pl) {
        local_fc = -1;
      }
      else {
        local_fc = this->strategy[pm_1._4_4_];
      }
      Solver::solve(&this->super_Solver,pm_1._4_4_,1 - iVar2,local_fc);
    }
    pm_1._4_4_ = pm_1._4_4_ + 1;
  } while( true );
}

Assistant:

void
QPTSolver::liftloop()
{
    /**
     * Initialize/reset progress measures / strategy
     */
    for (int i=0; i<k*nodecount(); i++) pm_nodes[i] = -1; // initialize all to _
    for (int i=0; i<nodecount(); i++) strategy[i] = -1;

    /**
     * Run first lifting loop
     */
    for (int n=nodecount()-1; n>=0; n--) {
        if (disabled[n]) continue;
        lift_attempt++;
        if (lift(n, -1)) {
            lift_count++;
#if 0
            for (int from : in[n]) {
                if (disabled[from]) continue;
                lift_attempt++;
                if (lift(from, n)) {
                    lift_count++;
                    todo_push(from);
                }
            }
#else
            todo_push(n);
#endif
        }
    }

    /**
     * Lift until fixed point
     */
    while (!todo.empty()) {
        int n = todo_pop();
        for (auto curedge = ins(n); *curedge != -1; curedge++) {
            int from = *curedge;
            if (disabled[from]) continue;
            lift_attempt++;
            if (lift(from, n)) {
                lift_count++;
                todo_push(from);
            }
        }
    }

    /**
     * Report final state.
     */
    if (trace) {
        for (int v=0; v<nodecount(); v++) {
            if (disabled[v]) continue;
            int *pm = pm_nodes + v*k;

            logger << "\033[1m" << label_vertex(v) << (owner(v)?" (odd)":" (even)") << "\033[m:";
            pm_stream(logger, pm, k);

            if (pm[0] == -1 or (pm[0]&1) != pl) {
                if (owner(v) != pl) {
                    if (strategy[v] == -1) logger << " no strategy!";
                    else logger << " => " << label_vertex(strategy[v]);
                }
            }
            
            logger << std::endl;
        }
    }

    /**
     * Derive strategies, mark as solved (only for opponent).
     */
    for (int v=0; v<nodecount(); v++) {
        if (disabled[v]) continue;
        int *pm = pm_nodes + v*k;

        if (pm[0] == -1 or (pm[0]&1) != pl) {
            if (owner(v) != pl and strategy[v] == -1) LOGIC_ERROR;
            Solver::solve(v, 1-pl, owner(v) != pl ? strategy[v] : -1);
        }
    }

    Solver::flush();
}